

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O0

void print_GeneralInformation(ClassFile *classFile)

{
  ushort uVar1;
  FILE *pFVar2;
  char *pcVar3;
  ClassFile *classFile_local;
  
  fprintf((FILE *)out,"\t Minor Version: \t\t %hu\n",(ulong)classFile->minor_version);
  pFVar2 = out;
  uVar1 = classFile->major_version;
  Utils::generateFriendlyVersionNumber(classFile);
  fprintf((FILE *)pFVar2,"\t Major Version: \t\t %hu [%.1f]\n",(ulong)uVar1);
  fprintf((FILE *)out,"\t Constant pool count: \t\t %hu\n",(ulong)classFile->constant_pool_count);
  pFVar2 = out;
  uVar1 = classFile->access_flags;
  pcVar3 = getAccessFlags(classFile->access_flags);
  fprintf((FILE *)pFVar2,"\t Access Flags: \t\t\t 0x%.4X [%s]\n",(ulong)uVar1,pcVar3);
  pFVar2 = out;
  uVar1 = classFile->this_class;
  pcVar3 = getFormattedConstant(classFile->constant_pool,classFile->this_class);
  fprintf((FILE *)pFVar2,"\t This class: \t\t\t cp_info #%hu <%s>\n",(ulong)uVar1,pcVar3);
  pFVar2 = out;
  if (classFile->super_class == 0) {
    fprintf((FILE *)out,"\t Super class: \t\t\t none\n");
  }
  else {
    uVar1 = classFile->super_class;
    pcVar3 = getFormattedConstant(classFile->constant_pool,classFile->super_class);
    fprintf((FILE *)pFVar2,"\t Super class: \t\t\t cp_info #%hu <%s>\n",(ulong)uVar1,pcVar3);
  }
  fprintf((FILE *)out,"\t Interfaces count: \t\t %hu\n",(ulong)classFile->interfaces_count);
  fprintf((FILE *)out,"\t Fields count: \t\t\t %hu\n",(ulong)classFile->fields_count);
  fprintf((FILE *)out,"\t Methods pool count: \t\t %hu\n",(ulong)classFile->methods_count);
  fprintf((FILE *)out,"\t Attributes pool count: \t %hu\n",(ulong)classFile->attributes_count);
  return;
}

Assistant:

void print_GeneralInformation (ClassFile *classFile) {
    
    fprintf(out,"\t Minor Version: \t\t %hu\n", classFile->minor_version);
    fprintf(out,"\t Major Version: \t\t %hu [%.1f]\n", classFile->major_version, Utils::generateFriendlyVersionNumber(classFile));
    fprintf(out,"\t Constant pool count: \t\t %hu\n", classFile->constant_pool_count);
    fprintf(out,"\t Access Flags: \t\t\t 0x%.4X [%s]\n", classFile->access_flags, getAccessFlags(classFile->access_flags));
    fprintf(out,"\t This class: \t\t\t cp_info #%hu <%s>\n", classFile->this_class, getFormattedConstant(classFile->constant_pool, classFile->this_class));
    
    if (classFile->super_class == 0) {
        fprintf(out,"\t Super class: \t\t\t none\n");
    } else {
        fprintf(out,"\t Super class: \t\t\t cp_info #%hu <%s>\n", classFile->super_class, getFormattedConstant(classFile->constant_pool, classFile->super_class));
    }
    
    fprintf(out,"\t Interfaces count: \t\t %hu\n", classFile->interfaces_count);
    fprintf(out,"\t Fields count: \t\t\t %hu\n", classFile->fields_count);
    fprintf(out,"\t Methods pool count: \t\t %hu\n", classFile->methods_count);
    fprintf(out,"\t Attributes pool count: \t %hu\n", classFile->attributes_count);
}